

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall
helics::apps::Recorder::buildArgParserApp(Recorder *this)

{
  string *psVar1;
  Option *pOVar2;
  App *this_00;
  Option *option_description;
  Option *pOVar3;
  Option *this_01;
  Option *__a;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar4;
  Option_group *capture_group;
  Option_group *clone_group;
  shared_ptr<helics::helicsCLI11App> *app;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffff9a8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff9b0;
  Option *in_stack_fffffffffffff9c0;
  char (*in_stack_fffffffffffff9c8) [42];
  allocator<char> *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffa08;
  undefined1 value;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *func;
  Option *in_stack_fffffffffffffa10;
  char (*in_stack_fffffffffffffa50) [133];
  string *in_stack_fffffffffffffa58;
  App *in_stack_fffffffffffffa60;
  App *this_03;
  string *in_stack_fffffffffffffa68;
  App *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  App *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffab8;
  App *in_stack_fffffffffffffac0;
  allocator<char> local_419 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c9 [2];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_379;
  allocator<char> local_351 [40];
  allocator<char> local_329 [33];
  Option *local_308;
  undefined1 local_2d1 [160];
  allocator<char> local_231 [40];
  allocator<char> local_209 [40];
  allocator<char> local_1e1 [48];
  allocator<char> local_1b1 [40];
  allocator<char> local_189 [40];
  allocator<char> local_161 [40];
  allocator<char> local_139 [40];
  allocator<char> local_111 [40];
  allocator<char> local_e9 [40];
  allocator<char> local_c1 [40];
  allocator<char> local_99 [40];
  allocator<char> local_71 [56];
  allocator<char> local_39 [40];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<helics::helicsCLI11App,char_const(&)[42]>(in_stack_fffffffffffff9c8);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20b55b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,(bool *)in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68);
  CLI::Option::ignore_underscore<CLI::App>
            (in_stack_fffffffffffffa10,SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_71);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_39);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20b663);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
             (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_c1);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_99);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20b74f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,(bool *)in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_111);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_e9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20b83b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_161);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_139);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20b927);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8);
  CLI::Option::capture_default_str(in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_1b1);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_189);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20ba28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  psVar1 = (string *)
           CLI::App::add_option_group<CLI::Option_group>
                     (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                      (string *)in_stack_fffffffffffffa60);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_209);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_1e1);
  local_1e1._33_8_ = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::add_option<const_char[52],_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (char (*) [52])in_stack_fffffffffffffa50);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Recorder::buildArgParserApp()::__0,void>
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  pOVar2 = CLI::Option::each(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  pOVar2 = CLI::OptionBase<CLI::Option>::delimiter(&pOVar2->super_OptionBase<CLI::Option>,',');
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x20bbf3);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::add_option<const_char[99],_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (char (*) [99])in_stack_fffffffffffffa50);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Recorder::buildArgParserApp()::__1,void>
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  pOVar2 = CLI::Option::each(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  this_00 = (App *)CLI::OptionBase<CLI::Option>::delimiter
                             (&pOVar2->super_OptionBase<CLI::Option>,',');
  pOVar2 = CLI::Option::ignore_underscore<CLI::App>
                     (in_stack_fffffffffffffa10,SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x20bd1b);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator((allocator<char> *)(local_2d1 + 0x50));
  this_03 = (App *)local_2d1;
  psVar1 = (string *)local_1e1._33_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  option_description =
       CLI::App::add_option<const_char[133],_(CLI::detail::enabler)0>
                 (this_03,psVar1,in_stack_fffffffffffffa50);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Recorder::buildArgParserApp()::__2,void>
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  pOVar3 = CLI::Option::each(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  value = (undefined1)((ulong)in_stack_fffffffffffffa08 >> 0x38);
  CLI::OptionBase<CLI::Option>::delimiter(&pOVar3->super_OptionBase<CLI::Option>,',');
  pOVar3 = CLI::Option::ignore_underscore<CLI::App>(in_stack_fffffffffffffa10,(bool)value);
  CLI::Option::type_size(pOVar3,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x20be43);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator((allocator<char> *)local_2d1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20be6a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  this_01 = (Option *)
            CLI::App::add_option_group<CLI::Option_group>
                      (this_00,(string *)pOVar2,(string *)this_03);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_351);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator(local_329);
  func = &local_379;
  local_308 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  CLI::App::add_option<const_char[81],_(CLI::detail::enabler)0>
            (this_03,psVar1,(char (*) [81])option_description);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Recorder::buildArgParserApp()::__3,void>
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  pOVar2 = CLI::Option::each(this_01,func);
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x20bff5);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  this_02 = local_3c9;
  pOVar3 = local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)pOVar3,in_stack_fffffffffffff9d0);
  __a = CLI::App::add_option<const_char[67],_(CLI::detail::enabler)0>
                  (this_03,psVar1,(char (*) [67])option_description);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Recorder::buildArgParserApp()::__4,void>
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  pOVar2 = CLI::Option::each(this_01,func);
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x20c0c7);
  std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
  std::allocator<char>::~allocator((allocator<char> *)local_3c9);
  pOVar2 = local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)pOVar3,(allocator<char> *)__a);
  pOVar3 = CLI::App::add_option<const_char[139],_(CLI::detail::enabler)0>
                     (this_03,psVar1,(char (*) [139])option_description);
  std::function<void(std::__cxx11::string)>::
  function<helics::apps::Recorder::buildArgParserApp()::__5,void>
            ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)pOVar2,(anon_class_8_1_8991fb9c *)pOVar3);
  pOVar2 = CLI::Option::each(this_01,func);
  CLI::Option::type_size(pOVar2,-1);
  CLI::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x20c197);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar2);
  std::allocator<char>::~allocator(local_419);
  sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> Recorder::buildArgParserApp()
{
    using gmlc::utilities::stringOps::removeQuotes;
    using gmlc::utilities::stringOps::splitlineQuotes;

    auto app = std::make_shared<helicsCLI11App>("Command line options for the Recorder App");
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();
    app->add_option(
        "--marker",
        nextPrintTimeStep,
        "print a statement indicating time advancement every <arg> period during the simulation");
    app->add_flag("--verbose", verbose, "print all value results to the screen");
    app->add_option("--mapfile",
                    mapfile,
                    "write progress to a map file for concurrent progress monitoring");

    app->add_option("--output,-o", outFileName, "the output file for recording the data")
        ->capture_default_str();

    auto* clone_group =
        app->add_option_group("cloning",
                              "Options related to endpoint cloning operations and specifications");
    clone_group->add_option("--clone", "existing endpoints to clone all packets to and from")
        ->each([this](const std::string& clone) {
            addDestEndpointClone(clone);
            addSourceEndpointClone(clone);
        })
        ->delimiter(',')
        ->type_size(-1);

    clone_group
        ->add_option(
            "--sourceclone",
            "existing endpoints to capture generated packets from, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    clone_group
        ->add_option("--destclone",
                     "existing endpoints to capture all packets with the specified endpoint as a "
                     "destination, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    auto* capture_group =
        app->add_option_group("capture_group",
                              "Options related to capturing publications, endpoints, or federates");
    capture_group
        ->add_option(
            "--tag,--publication,--pub",
            "tags(publications) to record, this argument may be specified any number of times")
        ->each([this](const std::string& tag) {
            auto taglist = splitlineQuotes(tag);
            for (const auto& tagname : taglist) {
                subkeys.emplace(removeQuotes(tagname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--endpoints",
                     "endpoints to capture, this argument may be specified multiple time")
        ->each([this](const std::string& ept) {
            auto eptlist = splitlineQuotes(ept);
            for (const auto& eptname : eptlist) {
                eptNames.emplace(removeQuotes(eptname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--capture",
                     "capture all the publications of a particular federate capture=\"fed1;fed2\"  "
                     "supports multiple arguments or a semicolon/comma separated list")
        ->each([this](const std::string& capt) {
            auto captFeds = splitlineQuotes(capt);
            for (auto& captFed : captFeds) {
                auto actCapt = removeQuotes(captFed);
                captureInterfaces.push_back(actCapt);
            }
        })
        ->type_size(-1);

    return app;
}